

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCase.cpp
# Opt level: O2

Move<vk::VkDevice_s_*> *
vkt::createDefaultDevice
          (Move<vk::VkDevice_s_*> *__return_storage_ptr__,InstanceInterface *vki,
          VkPhysicalDevice physicalDevice,deUint32 queueIndex,
          VkPhysicalDeviceFeatures *enabledFeatures,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *enabledExtensions,CommandLine *cmdLine)

{
  bool bVar1;
  NotSupportedError *this;
  pointer pbVar2;
  long lVar3;
  undefined4 in_register_0000000c;
  VkPhysicalDevice physicalDevice_00;
  ulong uVar4;
  pointer pbVar5;
  float queuePriority;
  Move<vk::VkDevice_s_*> *local_130;
  vector<const_char_*,_std::allocator<const_char_*>_> extensionPtrs;
  vector<const_char_*,_std::allocator<const_char_*>_> layerPtrs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enabledLayers;
  VkDeviceQueueCreateInfo queueInfo;
  VkDeviceCreateInfo deviceInfo;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  physicalDevice_00 = (VkPhysicalDevice)CONCAT44(in_register_0000000c,queueIndex);
  enabledLayers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  enabledLayers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  enabledLayers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  layerPtrs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  layerPtrs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  layerPtrs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  extensionPtrs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  extensionPtrs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  extensionPtrs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  queuePriority = 1.0;
  queueInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  queueInfo._4_4_ = 0;
  queueInfo.pNext = (void *)0x0;
  queueInfo.pQueuePriorities = (float *)0x0;
  queueInfo.flags = 0;
  queueInfo.queueFamilyIndex = 0;
  queueInfo.queueCount = 0;
  queueInfo._28_4_ = 0;
  deviceInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  deviceInfo._4_4_ = 0;
  deviceInfo.pNext = (void *)0x0;
  deviceInfo.flags = 0;
  deviceInfo.queueCreateInfoCount = 0;
  deviceInfo.pQueueCreateInfos = (VkDeviceQueueCreateInfo *)0x0;
  deviceInfo.enabledLayerCount = 0;
  deviceInfo._36_4_ = 0;
  deviceInfo.ppEnabledLayerNames = (char **)0x0;
  deviceInfo.enabledExtensionCount = 0;
  deviceInfo._52_4_ = 0;
  deviceInfo.ppEnabledExtensionNames = (char **)0x0;
  deviceInfo.pEnabledFeatures = (VkPhysicalDeviceFeatures *)0x0;
  local_130 = __return_storage_ptr__;
  bVar1 = tcu::CommandLine::isValidationEnabled(cmdLine);
  if (bVar1) {
    getValidationLayers_abi_cxx11_
              (&local_48,(vkt *)vki,(InstanceInterface *)physicalDevice,physicalDevice_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(&enabledLayers,&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    pbVar2 = enabledLayers.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar5 = enabledLayers.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (enabledLayers.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        enabledLayers.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this,"No validation layers found",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/vktTestCase.cpp"
                 ,0xa2);
      __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  else {
    pbVar2 = (pointer)0x0;
    pbVar5 = (pointer)0x0;
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
            (&layerPtrs,(long)pbVar5 - (long)pbVar2 >> 5);
  lVar3 = 0;
  for (uVar4 = 0;
      uVar4 < (ulong)((long)enabledLayers.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)enabledLayers.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar4 = uVar4 + 1) {
    *(undefined8 *)
     ((long)layerPtrs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start + lVar3) =
         *(undefined8 *)
          ((long)&((enabledLayers.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar3 * 4);
    lVar3 = lVar3 + 8;
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
            (&extensionPtrs,
             (long)(enabledExtensions->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(enabledExtensions->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5);
  lVar3 = 0;
  for (uVar4 = 0;
      pbVar2 = (enabledExtensions->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(enabledExtensions->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5);
      uVar4 = uVar4 + 1) {
    *(undefined8 *)
     ((long)extensionPtrs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start + lVar3) =
         *(undefined8 *)((long)&(pbVar2->_M_dataplus)._M_p + lVar3 * 4);
    lVar3 = lVar3 + 8;
  }
  deviceInfo.pQueueCreateInfos = &queueInfo;
  queueInfo.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
  queueInfo.pNext = (void *)0x0;
  queueInfo._16_8_ = (ulong)queueIndex << 0x20;
  queueInfo.queueCount = 1;
  queueInfo.pQueuePriorities = &queuePriority;
  deviceInfo.sType = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
  deviceInfo.pNext = (void *)0x0;
  deviceInfo.queueCreateInfoCount = 1;
  deviceInfo.ppEnabledExtensionNames =
       extensionPtrs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  if ((long)extensionPtrs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)extensionPtrs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    deviceInfo.ppEnabledExtensionNames = (pointer)0x0;
  }
  deviceInfo.enabledExtensionCount =
       (deUint32)
       ((ulong)((long)extensionPtrs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)extensionPtrs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                     _M_impl.super__Vector_impl_data._M_start) >> 3);
  deviceInfo.ppEnabledLayerNames =
       layerPtrs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  if ((long)layerPtrs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)layerPtrs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    deviceInfo.ppEnabledLayerNames = (pointer)0x0;
  }
  deviceInfo.enabledLayerCount =
       (deUint32)
       ((ulong)((long)layerPtrs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)layerPtrs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                     _M_impl.super__Vector_impl_data._M_start) >> 3);
  deviceInfo.pEnabledFeatures = enabledFeatures;
  ::vk::createDevice(local_130,vki,physicalDevice,&deviceInfo,(VkAllocationCallbacks *)0x0);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&extensionPtrs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&layerPtrs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&enabledLayers);
  return local_130;
}

Assistant:

Move<VkDevice> createDefaultDevice (const InstanceInterface&		vki,
									VkPhysicalDevice				physicalDevice,
									deUint32						queueIndex,
									const VkPhysicalDeviceFeatures&	enabledFeatures,
									const vector<string>&			enabledExtensions,
									const tcu::CommandLine&			cmdLine)
{
	VkDeviceQueueCreateInfo		queueInfo;
	VkDeviceCreateInfo			deviceInfo;
	vector<string>				enabledLayers;
	vector<const char*>			layerPtrs;
	vector<const char*>			extensionPtrs;
	const float					queuePriority	= 1.0f;

	deMemset(&queueInfo,	0, sizeof(queueInfo));
	deMemset(&deviceInfo,	0, sizeof(deviceInfo));

	if (cmdLine.isValidationEnabled())
	{
		enabledLayers = getValidationLayers(vki, physicalDevice);
		if (enabledLayers.empty())
			TCU_THROW(NotSupportedError, "No validation layers found");
	}

	layerPtrs.resize(enabledLayers.size());

	for (size_t ndx = 0; ndx < enabledLayers.size(); ++ndx)
		layerPtrs[ndx] = enabledLayers[ndx].c_str();

	extensionPtrs.resize(enabledExtensions.size());

	for (size_t ndx = 0; ndx < enabledExtensions.size(); ++ndx)
		extensionPtrs[ndx] = enabledExtensions[ndx].c_str();

	queueInfo.sType							= VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
	queueInfo.pNext							= DE_NULL;
	queueInfo.flags							= (VkDeviceQueueCreateFlags)0u;
	queueInfo.queueFamilyIndex				= queueIndex;
	queueInfo.queueCount					= 1u;
	queueInfo.pQueuePriorities				= &queuePriority;

	deviceInfo.sType						= VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
	deviceInfo.pNext						= DE_NULL;
	deviceInfo.queueCreateInfoCount			= 1u;
	deviceInfo.pQueueCreateInfos			= &queueInfo;
	deviceInfo.enabledExtensionCount		= (deUint32)extensionPtrs.size();
	deviceInfo.ppEnabledExtensionNames		= (extensionPtrs.empty() ? DE_NULL : &extensionPtrs[0]);
	deviceInfo.enabledLayerCount			= (deUint32)layerPtrs.size();
	deviceInfo.ppEnabledLayerNames			= (layerPtrs.empty() ? DE_NULL : &layerPtrs[0]);
	deviceInfo.pEnabledFeatures				= &enabledFeatures;

	return createDevice(vki, physicalDevice, &deviceInfo);
}